

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqobject.cpp
# Opt level: O3

void __thiscall SQGenerator::Mark(SQGenerator *this,SQCollectable **chain)

{
  ulong uVar1;
  long lVar2;
  
  uVar1 = (this->super_SQCollectable).super_SQRefCounted._uiRef;
  if (-1 < (int)uVar1) {
    (this->super_SQCollectable).super_SQRefCounted._uiRef = uVar1 | 0x80000000;
    if ((this->_stack)._size != 0) {
      lVar2 = 0;
      uVar1 = 0;
      do {
        SQSharedState::MarkObject
                  ((SQObjectPtr *)((long)&(((this->_stack)._vals)->super_SQObject)._type + lVar2),
                   (SQCollectable_conflict **)chain);
        uVar1 = uVar1 + 1;
        lVar2 = lVar2 + 0x10;
      } while (uVar1 < (this->_stack)._size);
    }
    SQSharedState::MarkObject(&this->_closure,(SQCollectable_conflict **)chain);
    SQCollectable::RemoveFromChain
              (&((this->super_SQCollectable)._sharedstate)->_gc_chain,(SQCollectable_conflict *)this
              );
    SQCollectable::AddToChain((SQCollectable_conflict **)chain,(SQCollectable_conflict *)this);
    return;
  }
  return;
}

Assistant:

void SQGenerator::Mark(SQCollectable **chain)
{
    START_MARK()
        for(SQUnsignedInteger i = 0; i < _stack.size(); i++) SQSharedState::MarkObject(_stack[i], chain);
        SQSharedState::MarkObject(_closure, chain);
    END_MARK()
}